

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  internal *this_01;
  char *size;
  bool bVar3;
  string *s;
  OneofOptions *msg;
  uint uVar4;
  uint res;
  undefined8 *puVar5;
  UnknownFieldSet *unknown;
  byte *pbVar6;
  Arena *arena;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_40;
  ArenaStringPtr *local_38;
  char *field_name;
  
  local_40 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->name_;
    do {
      bVar1 = *local_40;
      res = (uint)bVar1;
      pbVar6 = local_40 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
        if ((char)*pbVar6 < '\0') {
          pVar7 = internal::ReadTagFallback((char *)local_40,res);
          pbVar6 = (byte *)pVar7.first;
          res = pVar7.second;
        }
        else {
          pbVar6 = local_40 + 2;
        }
      }
      uVar4 = res >> 3;
      field_name = (char *)(ulong)uVar4;
      local_40 = pbVar6;
      if (uVar4 == 2) {
        if ((char)res != '\x12') goto LAB_0037281b;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        msg = this->options_;
        if (msg == (OneofOptions *)0x0) {
          arena = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            arena = *(Arena **)arena;
          }
          msg = Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(arena);
          this->options_ = msg;
        }
        local_40 = (byte *)internal::ParseContext::ParseMessage
                                     (ctx,(MessageLite *)msg,(char *)local_40);
      }
      else if ((uVar4 == 1) && ((char)res == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar5 = (undefined8 *)*puVar5;
        }
        s = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar5);
        local_40 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_40,ctx);
        this_01 = (internal *)(s->_M_dataplus)._M_p;
        size = (char *)s->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)size,"string length exceeds max size");
        }
        str.length_ = (size_type)"google.protobuf.OneofDescriptorProto.name";
        str.ptr_ = size;
        internal::VerifyUTF8(this_01,str,field_name);
      }
      else {
LAB_0037281b:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar6 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar6;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_40 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_40,ctx);
      }
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_40;
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.OneofDescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}